

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O0

string * Assimp::DefaultIOSystem::fileName(string *__return_storage_ptr__,string *path)

{
  string local_48 [32];
  long local_28;
  size_t last;
  string *local_18;
  string *path_local;
  string *ret;
  
  last._7_1_ = 0;
  local_18 = path;
  path_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  local_28 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0xa7fbfb);
  if (local_28 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultIOSystem::fileName(const std::string& path)
{
    std::string ret = path;
    std::size_t last = ret.find_last_of("\\/");
    if (last != std::string::npos) ret = ret.substr(last + 1);
    return ret;
}